

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pnodewalk.h
# Opt level: O0

ResultType __thiscall
ParseNodeWalker<WalkerPolicyTest>::WalkClass
          (ParseNodeWalker<WalkerPolicyTest> *this,ParseNodeClass *pnode,Context context)

{
  bool bVar1;
  ResultType result;
  Context context_local;
  ParseNodeClass *pnode_local;
  ParseNodeWalker<WalkerPolicyTest> *this_local;
  
  this_local._7_1_ =
       WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNode
                 ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                  &pnode->super_ParseNode,context);
  bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                    (&this->super_WalkerPolicyTest,this_local._7_1_);
  if (bVar1) {
    this_local._7_1_ =
         WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkFirstChild
                   ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                    pnode->pnodeExtends,context);
    bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                      (&this->super_WalkerPolicyTest,this_local._7_1_);
    if (bVar1) {
      this_local._7_1_ =
           WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*>::WalkNthChild
                     ((WalkerPolicyBase<bool,_ParseNodeWalker<WalkerPolicyTest>_*> *)this,
                      &pnode->super_ParseNode,&pnode->pnodeConstructor->super_ParseNode,context);
      bVar1 = ByteCodeGenerator::Generate::WalkerPolicyTest::ContinueWalk
                        (&this->super_WalkerPolicyTest,this_local._7_1_);
      if (bVar1) {
        this_local._7_1_ = WalkList(this,&pnode->super_ParseNode,&pnode->pnodeMembers,context);
      }
    }
  }
  return this_local._7_1_;
}

Assistant:

ResultType WalkClass(ParseNodeClass *pnode, Context context)
    {
        // First walk the class node itself
        ResultType result = WalkNode(pnode, context);
        if (!ContinueWalk(result)) return result;
        // Walk extends expr
        result = WalkFirstChild(pnode->pnodeExtends, context);
        if (!ContinueWalk(result)) return result;
        // Walk the constructor
        result = WalkNthChild(pnode, pnode->pnodeConstructor, context);
        if (!ContinueWalk(result)) return result;
        // Walk all non-static members
        result = WalkList(pnode, pnode->pnodeMembers, context);
        return result;
    }